

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O2

void __thiscall cdns_query::cdns_query(cdns_query *this)

{
  this->current_block = (cdnsBlock *)0x0;
  this->time_offset_usec = 0;
  this->client_address_index = -1;
  this->client_port = 0;
  this->transaction_id = 0;
  this->query_signature_index = -1;
  this->client_hoplimit = 0;
  this->delay_useconds = 0;
  this->query_name_index = -1;
  (this->rpd).bailiwick_index = 0;
  (this->rpd).processing_flags = 0;
  (this->rpd).is_present = false;
  this->query_size = 0;
  this->response_size = 0;
  (this->q_extended).question_index = -1;
  (this->q_extended).answer_index = -1;
  (this->q_extended).authority_index = -1;
  (this->q_extended).additional_index = -1;
  (this->q_extended).is_filled = false;
  (this->r_extended).question_index = -1;
  (this->r_extended).answer_index = -1;
  (this->r_extended).authority_index = -1;
  (this->r_extended).additional_index = -1;
  (this->r_extended).is_filled = false;
  return;
}

Assistant:

cdns_query::cdns_query():
    current_block(NULL),
    time_offset_usec(0),
    client_address_index(-1),
    client_port(0),
    transaction_id(0),
    query_signature_index(-1),
    client_hoplimit(0),
    delay_useconds(0),
    query_name_index(-1),
    query_size(0),
    response_size(0)
{
}